

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_init(cubeb_conflict **context,char *context_name)

{
  int iVar1;
  cubeb_conflict *ctx_00;
  long lVar2;
  undefined8 *puVar3;
  pa_threaded_mainloop *ppVar4;
  pa_stream *stream;
  pa_operation *ppVar5;
  char *in_RSI;
  undefined8 *in_RDI;
  char *version;
  pa_operation *o;
  cubeb_conflict *ctx;
  void *libpulse;
  pa_operation *in_stack_ffffffffffffffb8;
  pa_subscription_mask_t mask;
  long local_20;
  int local_4;
  
  *in_RDI = 0;
  local_20 = dlopen("libpulse.so.0",1);
  if ((local_20 == 0) && (local_20 = dlopen("libpulse.so",1), local_20 == 0)) {
    local_4 = -1;
  }
  else {
    cubeb_pa_channel_map_can_balance =
         (_func_int_pa_channel_map_ptr *)dlsym(local_20,"pa_channel_map_can_balance");
    if (cubeb_pa_channel_map_can_balance == (_func_int_pa_channel_map_ptr *)0x0) {
      dlclose(local_20);
      local_4 = -1;
    }
    else {
      cubeb_pa_channel_map_init =
           (_func_pa_channel_map_ptr_pa_channel_map_ptr *)dlsym(local_20,"pa_channel_map_init");
      if (cubeb_pa_channel_map_init == (_func_pa_channel_map_ptr_pa_channel_map_ptr *)0x0) {
        dlclose(local_20);
        local_4 = -1;
      }
      else {
        cubeb_pa_context_connect =
             (_func_int_pa_context_ptr_char_ptr_pa_context_flags_t_pa_spawn_api_ptr *)
             dlsym(local_20,"pa_context_connect");
        if (cubeb_pa_context_connect ==
            (_func_int_pa_context_ptr_char_ptr_pa_context_flags_t_pa_spawn_api_ptr *)0x0) {
          dlclose(local_20);
          local_4 = -1;
        }
        else {
          cubeb_pa_context_disconnect =
               (_func_void_pa_context_ptr *)dlsym(local_20,"pa_context_disconnect");
          if (cubeb_pa_context_disconnect == (_func_void_pa_context_ptr *)0x0) {
            dlclose(local_20);
            local_4 = -1;
          }
          else {
            cubeb_pa_context_drain =
                 (_func_pa_operation_ptr_pa_context_ptr_pa_context_notify_cb_t_void_ptr *)
                 dlsym(local_20,"pa_context_drain");
            if (cubeb_pa_context_drain ==
                (_func_pa_operation_ptr_pa_context_ptr_pa_context_notify_cb_t_void_ptr *)0x0) {
              dlclose(local_20);
              local_4 = -1;
            }
            else {
              cubeb_pa_context_get_server_info =
                   (_func_pa_operation_ptr_pa_context_ptr_pa_server_info_cb_t_void_ptr *)
                   dlsym(local_20,"pa_context_get_server_info");
              if (cubeb_pa_context_get_server_info ==
                  (_func_pa_operation_ptr_pa_context_ptr_pa_server_info_cb_t_void_ptr *)0x0) {
                dlclose(local_20);
                local_4 = -1;
              }
              else {
                cubeb_pa_context_get_sink_info_by_name =
                     (_func_pa_operation_ptr_pa_context_ptr_char_ptr_pa_sink_info_cb_t_void_ptr *)
                     dlsym(local_20,"pa_context_get_sink_info_by_name");
                if (cubeb_pa_context_get_sink_info_by_name ==
                    (_func_pa_operation_ptr_pa_context_ptr_char_ptr_pa_sink_info_cb_t_void_ptr *)0x0
                   ) {
                  dlclose(local_20);
                  local_4 = -1;
                }
                else {
                  cubeb_pa_context_get_sink_info_list =
                       (_func_pa_operation_ptr_pa_context_ptr_pa_sink_info_cb_t_void_ptr *)
                       dlsym(local_20,"pa_context_get_sink_info_list");
                  if (cubeb_pa_context_get_sink_info_list ==
                      (_func_pa_operation_ptr_pa_context_ptr_pa_sink_info_cb_t_void_ptr *)0x0) {
                    dlclose(local_20);
                    local_4 = -1;
                  }
                  else {
                    cubeb_pa_context_get_sink_input_info =
                         (_func_pa_operation_ptr_pa_context_ptr_uint32_t_pa_sink_input_info_cb_t_void_ptr
                          *)dlsym(local_20,"pa_context_get_sink_input_info");
                    if (cubeb_pa_context_get_sink_input_info ==
                        (_func_pa_operation_ptr_pa_context_ptr_uint32_t_pa_sink_input_info_cb_t_void_ptr
                         *)0x0) {
                      dlclose(local_20);
                      local_4 = -1;
                    }
                    else {
                      cubeb_pa_context_get_source_info_list =
                           (_func_pa_operation_ptr_pa_context_ptr_pa_source_info_cb_t_void_ptr *)
                           dlsym(local_20,"pa_context_get_source_info_list");
                      if (cubeb_pa_context_get_source_info_list ==
                          (_func_pa_operation_ptr_pa_context_ptr_pa_source_info_cb_t_void_ptr *)0x0)
                      {
                        dlclose(local_20);
                        local_4 = -1;
                      }
                      else {
                        cubeb_pa_context_get_state =
                             (_func_pa_context_state_t_pa_context_ptr *)
                             dlsym(local_20,"pa_context_get_state");
                        if (cubeb_pa_context_get_state ==
                            (_func_pa_context_state_t_pa_context_ptr *)0x0) {
                          dlclose(local_20);
                          local_4 = -1;
                        }
                        else {
                          cubeb_pa_context_new =
                               (_func_pa_context_ptr_pa_mainloop_api_ptr_char_ptr *)
                               dlsym(local_20,"pa_context_new");
                          if (cubeb_pa_context_new ==
                              (_func_pa_context_ptr_pa_mainloop_api_ptr_char_ptr *)0x0) {
                            dlclose(local_20);
                            local_4 = -1;
                          }
                          else {
                            cubeb_pa_context_rttime_new =
                                 (_func_pa_time_event_ptr_pa_context_ptr_pa_usec_t_pa_time_event_cb_t_void_ptr
                                  *)dlsym(local_20,"pa_context_rttime_new");
                            if (cubeb_pa_context_rttime_new ==
                                (_func_pa_time_event_ptr_pa_context_ptr_pa_usec_t_pa_time_event_cb_t_void_ptr
                                 *)0x0) {
                              dlclose(local_20);
                              local_4 = -1;
                            }
                            else {
                              cubeb_pa_context_set_sink_input_volume =
                                   (_func_pa_operation_ptr_pa_context_ptr_uint32_t_pa_cvolume_ptr_pa_context_success_cb_t_void_ptr
                                    *)dlsym(local_20,"pa_context_set_sink_input_volume");
                              if (cubeb_pa_context_set_sink_input_volume ==
                                  (_func_pa_operation_ptr_pa_context_ptr_uint32_t_pa_cvolume_ptr_pa_context_success_cb_t_void_ptr
                                   *)0x0) {
                                dlclose(local_20);
                                local_4 = -1;
                              }
                              else {
                                cubeb_pa_context_set_state_callback =
                                     (_func_void_pa_context_ptr_pa_context_notify_cb_t_void_ptr *)
                                     dlsym(local_20,"pa_context_set_state_callback");
                                if (cubeb_pa_context_set_state_callback ==
                                    (_func_void_pa_context_ptr_pa_context_notify_cb_t_void_ptr *)0x0
                                   ) {
                                  dlclose(local_20);
                                  local_4 = -1;
                                }
                                else {
                                  cubeb_pa_context_unref =
                                       (_func_void_pa_context_ptr *)
                                       dlsym(local_20,"pa_context_unref");
                                  if (cubeb_pa_context_unref == (_func_void_pa_context_ptr *)0x0) {
                                    dlclose(local_20);
                                    local_4 = -1;
                                  }
                                  else {
                                    cubeb_pa_cvolume_set =
                                         (_func_pa_cvolume_ptr_pa_cvolume_ptr_uint_pa_volume_t *)
                                         dlsym(local_20,"pa_cvolume_set");
                                    if (cubeb_pa_cvolume_set ==
                                        (_func_pa_cvolume_ptr_pa_cvolume_ptr_uint_pa_volume_t *)0x0)
                                    {
                                      dlclose(local_20);
                                      local_4 = -1;
                                    }
                                    else {
                                      cubeb_pa_cvolume_set_balance =
                                           (_func_pa_cvolume_ptr_pa_cvolume_ptr_pa_channel_map_ptr_float
                                            *)dlsym(local_20,"pa_cvolume_set_balance");
                                      if (cubeb_pa_cvolume_set_balance ==
                                          (_func_pa_cvolume_ptr_pa_cvolume_ptr_pa_channel_map_ptr_float
                                           *)0x0) {
                                        dlclose(local_20);
                                        local_4 = -1;
                                      }
                                      else {
                                        cubeb_pa_frame_size =
                                             (_func_size_t_pa_sample_spec_ptr *)
                                             dlsym(local_20,"pa_frame_size");
                                        if (cubeb_pa_frame_size ==
                                            (_func_size_t_pa_sample_spec_ptr *)0x0) {
                                          dlclose(local_20);
                                          local_4 = -1;
                                        }
                                        else {
                                          cubeb_pa_operation_get_state =
                                               (_func_pa_operation_state_t_pa_operation_ptr *)
                                               dlsym(local_20,"pa_operation_get_state");
                                          if (cubeb_pa_operation_get_state ==
                                              (_func_pa_operation_state_t_pa_operation_ptr *)0x0) {
                                            dlclose(local_20);
                                            local_4 = -1;
                                          }
                                          else {
                                            cubeb_pa_operation_unref =
                                                 (_func_void_pa_operation_ptr *)
                                                 dlsym(local_20,"pa_operation_unref");
                                            if (cubeb_pa_operation_unref ==
                                                (_func_void_pa_operation_ptr *)0x0) {
                                              dlclose(local_20);
                                              local_4 = -1;
                                            }
                                            else {
                                              cubeb_pa_proplist_gets =
                                                   (_func_char_ptr_pa_proplist_ptr_char_ptr *)
                                                   dlsym(local_20,"pa_proplist_gets");
                                              if (cubeb_pa_proplist_gets ==
                                                  (_func_char_ptr_pa_proplist_ptr_char_ptr *)0x0) {
                                                dlclose(local_20);
                                                local_4 = -1;
                                              }
                                              else {
                                                cubeb_pa_rtclock_now =
                                                     (_func_pa_usec_t *)
                                                     dlsym(local_20,"pa_rtclock_now");
                                                if (cubeb_pa_rtclock_now == (_func_pa_usec_t *)0x0)
                                                {
                                                  dlclose(local_20);
                                                  local_4 = -1;
                                                }
                                                else {
                                                  cubeb_pa_stream_begin_write =
                                                       (
                                                  _func_int_pa_stream_ptr_void_ptr_ptr_size_t_ptr *)
                                                  dlsym(local_20,"pa_stream_begin_write");
                                                  if (cubeb_pa_stream_begin_write ==
                                                      (
                                                  _func_int_pa_stream_ptr_void_ptr_ptr_size_t_ptr *)
                                                  0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_cancel_write =
                                                         (_func_int_pa_stream_ptr *)
                                                         dlsym(local_20,"pa_stream_cancel_write");
                                                    if (cubeb_pa_stream_cancel_write ==
                                                        (_func_int_pa_stream_ptr *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_stream_connect_playback =
                                                           (
                                                  _func_int_pa_stream_ptr_char_ptr_pa_buffer_attr_ptr_pa_stream_flags_t_pa_cvolume_ptr_pa_stream_ptr
                                                  *)dlsym(local_20,"pa_stream_connect_playback");
                                                  if (cubeb_pa_stream_connect_playback ==
                                                      (
                                                  _func_int_pa_stream_ptr_char_ptr_pa_buffer_attr_ptr_pa_stream_flags_t_pa_cvolume_ptr_pa_stream_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_cork =
                                                         (
                                                  _func_pa_operation_ptr_pa_stream_ptr_int_pa_stream_success_cb_t_void_ptr
                                                  *)dlsym(local_20,"pa_stream_cork");
                                                  if (cubeb_pa_stream_cork ==
                                                      (
                                                  _func_pa_operation_ptr_pa_stream_ptr_int_pa_stream_success_cb_t_void_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_disconnect =
                                                         (_func_int_pa_stream_ptr *)
                                                         dlsym(local_20,"pa_stream_disconnect");
                                                    if (cubeb_pa_stream_disconnect ==
                                                        (_func_int_pa_stream_ptr *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_stream_get_channel_map =
                                                           (_func_pa_channel_map_ptr_pa_stream_ptr *
                                                           )dlsym(local_20,
                                                  "pa_stream_get_channel_map");
                                                  if (cubeb_pa_stream_get_channel_map ==
                                                      (_func_pa_channel_map_ptr_pa_stream_ptr *)0x0)
                                                  {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_get_index =
                                                         (_func_uint32_t_pa_stream_ptr *)
                                                         dlsym(local_20,"pa_stream_get_index");
                                                    if (cubeb_pa_stream_get_index ==
                                                        (_func_uint32_t_pa_stream_ptr *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_stream_get_latency =
                                                           (
                                                  _func_int_pa_stream_ptr_pa_usec_t_ptr_int_ptr *)
                                                  dlsym(local_20,"pa_stream_get_latency");
                                                  if (cubeb_pa_stream_get_latency ==
                                                      (_func_int_pa_stream_ptr_pa_usec_t_ptr_int_ptr
                                                       *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_get_sample_spec =
                                                         (_func_pa_sample_spec_ptr_pa_stream_ptr *)
                                                         dlsym(local_20,"pa_stream_get_sample_spec")
                                                    ;
                                                    if (cubeb_pa_stream_get_sample_spec ==
                                                        (_func_pa_sample_spec_ptr_pa_stream_ptr *)
                                                        0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_stream_get_state =
                                                           (_func_pa_stream_state_t_pa_stream_ptr *)
                                                           dlsym(local_20,"pa_stream_get_state");
                                                      if (cubeb_pa_stream_get_state ==
                                                          (_func_pa_stream_state_t_pa_stream_ptr *)
                                                          0x0) {
                                                        dlclose(local_20);
                                                        local_4 = -1;
                                                      }
                                                      else {
                                                        cubeb_pa_stream_get_time =
                                                             (_func_int_pa_stream_ptr_pa_usec_t_ptr
                                                              *)dlsym(local_20,"pa_stream_get_time")
                                                        ;
                                                        if (cubeb_pa_stream_get_time ==
                                                            (_func_int_pa_stream_ptr_pa_usec_t_ptr *
                                                            )0x0) {
                                                          dlclose(local_20);
                                                          local_4 = -1;
                                                        }
                                                        else {
                                                          cubeb_pa_stream_new =
                                                               (
                                                  _func_pa_stream_ptr_pa_context_ptr_char_ptr_pa_sample_spec_ptr_pa_channel_map_ptr
                                                  *)dlsym(local_20,"pa_stream_new");
                                                  if (cubeb_pa_stream_new ==
                                                      (
                                                  _func_pa_stream_ptr_pa_context_ptr_char_ptr_pa_sample_spec_ptr_pa_channel_map_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_set_state_callback =
                                                         (
                                                  _func_void_pa_stream_ptr_pa_stream_notify_cb_t_void_ptr
                                                  *)dlsym(local_20,"pa_stream_set_state_callback");
                                                  if (cubeb_pa_stream_set_state_callback ==
                                                      (
                                                  _func_void_pa_stream_ptr_pa_stream_notify_cb_t_void_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_set_write_callback =
                                                         (
                                                  _func_void_pa_stream_ptr_pa_stream_request_cb_t_void_ptr
                                                  *)dlsym(local_20,"pa_stream_set_write_callback");
                                                  if (cubeb_pa_stream_set_write_callback ==
                                                      (
                                                  _func_void_pa_stream_ptr_pa_stream_request_cb_t_void_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_unref =
                                                         (_func_void_pa_stream_ptr *)
                                                         dlsym(local_20,"pa_stream_unref");
                                                    if (cubeb_pa_stream_unref ==
                                                        (_func_void_pa_stream_ptr *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_stream_update_timing_info =
                                                           (
                                                  _func_pa_operation_ptr_pa_stream_ptr_pa_stream_success_cb_t_void_ptr
                                                  *)dlsym(local_20,"pa_stream_update_timing_info");
                                                  if (cubeb_pa_stream_update_timing_info ==
                                                      (
                                                  _func_pa_operation_ptr_pa_stream_ptr_pa_stream_success_cb_t_void_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_write =
                                                         (
                                                  _func_int_pa_stream_ptr_void_ptr_size_t_pa_free_cb_t_int64_t_pa_seek_mode_t
                                                  *)dlsym(local_20,"pa_stream_write");
                                                  if (cubeb_pa_stream_write ==
                                                      (
                                                  _func_int_pa_stream_ptr_void_ptr_size_t_pa_free_cb_t_int64_t_pa_seek_mode_t
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_sw_volume_from_linear =
                                                         (_func_pa_volume_t_double *)
                                                         dlsym(local_20,"pa_sw_volume_from_linear");
                                                    if (cubeb_pa_sw_volume_from_linear ==
                                                        (_func_pa_volume_t_double *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_threaded_mainloop_free =
                                                           (_func_void_pa_threaded_mainloop_ptr *)
                                                           dlsym(local_20,
                                                  "pa_threaded_mainloop_free");
                                                  if (cubeb_pa_threaded_mainloop_free ==
                                                      (_func_void_pa_threaded_mainloop_ptr *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_threaded_mainloop_get_api =
                                                         (
                                                  _func_pa_mainloop_api_ptr_pa_threaded_mainloop_ptr
                                                  *)dlsym(local_20,"pa_threaded_mainloop_get_api");
                                                  if (cubeb_pa_threaded_mainloop_get_api ==
                                                      (
                                                  _func_pa_mainloop_api_ptr_pa_threaded_mainloop_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_threaded_mainloop_in_thread =
                                                         (_func_int_pa_threaded_mainloop_ptr *)
                                                         dlsym(local_20,
                                                  "pa_threaded_mainloop_in_thread");
                                                  if (cubeb_pa_threaded_mainloop_in_thread ==
                                                      (_func_int_pa_threaded_mainloop_ptr *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_threaded_mainloop_lock =
                                                         (_func_void_pa_threaded_mainloop_ptr *)
                                                         dlsym(local_20,"pa_threaded_mainloop_lock")
                                                    ;
                                                    if (cubeb_pa_threaded_mainloop_lock ==
                                                        (_func_void_pa_threaded_mainloop_ptr *)0x0)
                                                    {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_threaded_mainloop_new =
                                                           (_func_pa_threaded_mainloop_ptr *)
                                                           dlsym(local_20,"pa_threaded_mainloop_new"
                                                                );
                                                      if (cubeb_pa_threaded_mainloop_new ==
                                                          (_func_pa_threaded_mainloop_ptr *)0x0) {
                                                        dlclose(local_20);
                                                        local_4 = -1;
                                                      }
                                                      else {
                                                        cubeb_pa_threaded_mainloop_signal =
                                                             (
                                                  _func_void_pa_threaded_mainloop_ptr_int *)
                                                  dlsym(local_20,"pa_threaded_mainloop_signal");
                                                  if (cubeb_pa_threaded_mainloop_signal ==
                                                      (_func_void_pa_threaded_mainloop_ptr_int *)0x0
                                                     ) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_threaded_mainloop_start =
                                                         (_func_int_pa_threaded_mainloop_ptr *)
                                                         dlsym(local_20,"pa_threaded_mainloop_start"
                                                              );
                                                    if (cubeb_pa_threaded_mainloop_start ==
                                                        (_func_int_pa_threaded_mainloop_ptr *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_threaded_mainloop_stop =
                                                           (_func_void_pa_threaded_mainloop_ptr *)
                                                           dlsym(local_20,
                                                  "pa_threaded_mainloop_stop");
                                                  if (cubeb_pa_threaded_mainloop_stop ==
                                                      (_func_void_pa_threaded_mainloop_ptr *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_threaded_mainloop_unlock =
                                                         (_func_void_pa_threaded_mainloop_ptr *)
                                                         dlsym(local_20,
                                                  "pa_threaded_mainloop_unlock");
                                                  if (cubeb_pa_threaded_mainloop_unlock ==
                                                      (_func_void_pa_threaded_mainloop_ptr *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_threaded_mainloop_wait =
                                                         (_func_void_pa_threaded_mainloop_ptr *)
                                                         dlsym(local_20,"pa_threaded_mainloop_wait")
                                                    ;
                                                    if (cubeb_pa_threaded_mainloop_wait ==
                                                        (_func_void_pa_threaded_mainloop_ptr *)0x0)
                                                    {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_usec_to_bytes =
                                                           (
                                                  _func_size_t_pa_usec_t_pa_sample_spec_ptr *)
                                                  dlsym(local_20,"pa_usec_to_bytes");
                                                  if (cubeb_pa_usec_to_bytes ==
                                                      (_func_size_t_pa_usec_t_pa_sample_spec_ptr *)
                                                      0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_set_read_callback =
                                                         (
                                                  _func_void_pa_stream_ptr_pa_stream_request_cb_t_void_ptr
                                                  *)dlsym(local_20,"pa_stream_set_read_callback");
                                                  if (cubeb_pa_stream_set_read_callback ==
                                                      (
                                                  _func_void_pa_stream_ptr_pa_stream_request_cb_t_void_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_connect_record =
                                                         (
                                                  _func_int_pa_stream_ptr_char_ptr_pa_buffer_attr_ptr_pa_stream_flags_t
                                                  *)dlsym(local_20,"pa_stream_connect_record");
                                                  if (cubeb_pa_stream_connect_record ==
                                                      (
                                                  _func_int_pa_stream_ptr_char_ptr_pa_buffer_attr_ptr_pa_stream_flags_t
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_readable_size =
                                                         (_func_size_t_pa_stream_ptr *)
                                                         dlsym(local_20,"pa_stream_readable_size");
                                                    if (cubeb_pa_stream_readable_size ==
                                                        (_func_size_t_pa_stream_ptr *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_stream_writable_size =
                                                           (_func_size_t_pa_stream_ptr *)
                                                           dlsym(local_20,"pa_stream_writable_size")
                                                      ;
                                                      if (cubeb_pa_stream_writable_size ==
                                                          (_func_size_t_pa_stream_ptr *)0x0) {
                                                        dlclose(local_20);
                                                        local_4 = -1;
                                                      }
                                                      else {
                                                        cubeb_pa_stream_peek =
                                                             (
                                                  _func_int_pa_stream_ptr_void_ptr_ptr_size_t_ptr *)
                                                  dlsym(local_20,"pa_stream_peek");
                                                  if (cubeb_pa_stream_peek ==
                                                      (
                                                  _func_int_pa_stream_ptr_void_ptr_ptr_size_t_ptr *)
                                                  0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_drop =
                                                         (_func_int_pa_stream_ptr *)
                                                         dlsym(local_20,"pa_stream_drop");
                                                    if (cubeb_pa_stream_drop ==
                                                        (_func_int_pa_stream_ptr *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_stream_get_buffer_attr =
                                                           (_func_pa_buffer_attr_ptr_pa_stream_ptr *
                                                           )dlsym(local_20,
                                                  "pa_stream_get_buffer_attr");
                                                  if (cubeb_pa_stream_get_buffer_attr ==
                                                      (_func_pa_buffer_attr_ptr_pa_stream_ptr *)0x0)
                                                  {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_get_device_name =
                                                         (_func_char_ptr_pa_stream_ptr *)
                                                         dlsym(local_20,"pa_stream_get_device_name")
                                                    ;
                                                    if (cubeb_pa_stream_get_device_name ==
                                                        (_func_char_ptr_pa_stream_ptr *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_context_set_subscribe_callback =
                                                           (
                                                  _func_void_pa_context_ptr_pa_context_subscribe_cb_t_void_ptr
                                                  *)dlsym(local_20,
                                                  "pa_context_set_subscribe_callback");
                                                  if (cubeb_pa_context_set_subscribe_callback ==
                                                      (
                                                  _func_void_pa_context_ptr_pa_context_subscribe_cb_t_void_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_context_subscribe =
                                                         (
                                                  _func_pa_operation_ptr_pa_context_ptr_pa_subscription_mask_t_pa_context_success_cb_t_void_ptr
                                                  *)dlsym(local_20,"pa_context_subscribe");
                                                  if (cubeb_pa_context_subscribe ==
                                                      (
                                                  _func_pa_operation_ptr_pa_context_ptr_pa_subscription_mask_t_pa_context_success_cb_t_void_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_mainloop_api_once =
                                                         (
                                                  _func_void_pa_mainloop_api_ptr__func_void_pa_mainloop_api_ptr_void_ptr_ptr_void_ptr
                                                  *)dlsym(local_20,"pa_mainloop_api_once");
                                                  if (cubeb_pa_mainloop_api_once ==
                                                      (
                                                  _func_void_pa_mainloop_api_ptr__func_void_pa_mainloop_api_ptr_void_ptr_ptr_void_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_get_library_version =
                                                         (_func_char_ptr *)
                                                         dlsym(local_20,"pa_get_library_version");
                                                    if (cubeb_pa_get_library_version ==
                                                        (_func_char_ptr *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_pa_channel_map_init_auto =
                                                           (
                                                  _func_pa_channel_map_ptr_pa_channel_map_ptr_uint_pa_channel_map_def_t
                                                  *)dlsym(local_20,"pa_channel_map_init_auto");
                                                  if (cubeb_pa_channel_map_init_auto ==
                                                      (
                                                  _func_pa_channel_map_ptr_pa_channel_map_ptr_uint_pa_channel_map_def_t
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_pa_stream_set_name =
                                                         (
                                                  _func_pa_operation_ptr_pa_stream_ptr_char_ptr_pa_stream_success_cb_t_void_ptr
                                                  *)dlsym(local_20,"pa_stream_set_name");
                                                  if (cubeb_pa_stream_set_name ==
                                                      (
                                                  _func_pa_operation_ptr_pa_stream_ptr_char_ptr_pa_stream_success_cb_t_void_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    ctx_00 = (cubeb_conflict *)
                                                             (*cubeb_pa_get_library_version)();
                                                    lVar2 = strtol((char *)ctx_00,(char **)0x0,10);
                                                    has_pulse_v2 = (int)(1 < lVar2);
                                                    puVar3 = (undefined8 *)calloc(1,0x60);
                                                    *puVar3 = &pulse_ops;
                                                    puVar3[1] = local_20;
                                                    iVar1 = cubeb_strings_init((cubeb_strings **)
                                                                                                                                                              
                                                  in_stack_ffffffffffffffb8);
                                                  if (iVar1 == 0) {
                                                    ppVar4 = (*cubeb_pa_threaded_mainloop_new)();
                                                    puVar3[2] = ppVar4;
                                                    puVar3[4] = 0;
                                                    (*cubeb_pa_threaded_mainloop_start)
                                                              ((pa_threaded_mainloop *)puVar3[2]);
                                                    if (in_RSI == (char *)0x0) {
                                                      stream = (pa_stream *)0x0;
                                                    }
                                                    else {
                                                      stream = (pa_stream *)strdup(in_RSI);
                                                    }
                                                    puVar3[5] = stream;
                                                    iVar1 = pulse_context_init(ctx_00);
                                                    if (iVar1 == 0) {
                                                      (*cubeb_pa_threaded_mainloop_lock)
                                                                ((pa_threaded_mainloop *)puVar3[2]);
                                                      ppVar5 = (*cubeb_pa_context_get_server_info)
                                                                         ((pa_context *)puVar3[3],
                                                                          server_info_callback,
                                                                          puVar3);
                                                      if (ppVar5 != (pa_operation *)0x0) {
                                                        operation_wait(ctx_00,stream,
                                                                       in_stack_ffffffffffffffb8);
                                                        (*cubeb_pa_operation_unref)(ppVar5);
                                                      }
                                                      mask = (pa_subscription_mask_t)
                                                             ((ulong)stream >> 0x20);
                                                      (*cubeb_pa_threaded_mainloop_unlock)
                                                                ((pa_threaded_mainloop *)puVar3[2]);
                                                      pulse_subscribe_notifications(ctx_00,mask);
                                                      *in_RDI = puVar3;
                                                      local_4 = 0;
                                                    }
                                                    else {
                                                      pulse_destroy((cubeb_conflict *)0x1394f5);
                                                      local_4 = -1;
                                                    }
                                                  }
                                                  else {
                                                    pulse_destroy((cubeb_conflict *)0x13946e);
                                                    local_4 = -1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int
pulse_init(cubeb ** context, char const * context_name)
{
  void * libpulse = NULL;
  cubeb * ctx;
  pa_operation * o;

  *context = NULL;

#ifndef DISABLE_LIBPULSE_DLOPEN
  libpulse = dlopen("libpulse.so.0", RTLD_LAZY);
  if (!libpulse) {
    libpulse = dlopen("libpulse.so", RTLD_LAZY);
    if (!libpulse) {
      return CUBEB_ERROR;
    }
  }

#define LOAD(x) {                               \
    cubeb_##x = dlsym(libpulse, #x);            \
    if (!cubeb_##x) {                           \
      dlclose(libpulse);                        \
      return CUBEB_ERROR;                       \
    }                                           \
  }

  LIBPULSE_API_VISIT(LOAD);
#undef LOAD
#endif

#if PA_CHECK_VERSION(2, 0, 0)
  const char* version = WRAP(pa_get_library_version)();
  has_pulse_v2 = strtol(version, NULL, 10) >= 2;
#endif

  ctx = calloc(1, sizeof(*ctx));
  assert(ctx);

  ctx->ops = &pulse_ops;
  ctx->libpulse = libpulse;
  if (cubeb_strings_init(&ctx->device_ids) != CUBEB_OK) {
    pulse_destroy(ctx);
    return CUBEB_ERROR;
  }

  ctx->mainloop = WRAP(pa_threaded_mainloop_new)();
  ctx->default_sink_info = NULL;

  WRAP(pa_threaded_mainloop_start)(ctx->mainloop);

  ctx->context_name = context_name ? strdup(context_name) : NULL;
  if (pulse_context_init(ctx) != 0) {
    pulse_destroy(ctx);
    return CUBEB_ERROR;
  }

  /* server_info_callback performs a second async query, which is
     responsible for initializing default_sink_info and signalling the
     mainloop to end the wait. */
  WRAP(pa_threaded_mainloop_lock)(ctx->mainloop);
  o = WRAP(pa_context_get_server_info)(ctx->context, server_info_callback, ctx);
  if (o) {
    operation_wait(ctx, NULL, o);
    WRAP(pa_operation_unref)(o);
  }
  WRAP(pa_threaded_mainloop_unlock)(ctx->mainloop);

  /* Update `default_sink_info` when the default device changes. */
  pulse_subscribe_notifications(ctx, PA_SUBSCRIPTION_MASK_SERVER);

  *context = ctx;

  return CUBEB_OK;
}